

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

void __thiscall
boost::detail::multi_array::
multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
::compute_strides<boost::array<long,3ul>,boost::array<unsigned_long,3ul>>
          (multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
           *this,array<long,_3UL> *stride_list,array<unsigned_long,_3UL> *extent_list,
          general_storage_order<3UL> *storage)

{
  unsigned_long uVar1;
  index stride;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = 1;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    uVar1 = (storage->ordering_).elems[lVar3];
    lVar4 = -lVar2;
    if ((storage->ascending_).elems[uVar1] != false) {
      lVar4 = lVar2;
    }
    stride_list->elems[uVar1] = lVar4;
    lVar2 = lVar2 * extent_list->elems[(storage->ordering_).elems[lVar3]];
  }
  return;
}

Assistant:

void compute_strides(StrideList& stride_list, ExtentList& extent_list,
                       const general_storage_order<NumDims>& storage)
  {
    // invariant: stride = the stride for dimension n
    index stride = 1;
    for (size_type n = 0; n != NumDims; ++n) {
      index stride_sign = +1;
      
      if (!storage.ascending(storage.ordering(n)))
        stride_sign = -1;
      
      // The stride for this dimension is the product of the
      // lengths of the ranks minor to it.
      stride_list[storage.ordering(n)] = stride * stride_sign;
      
      stride *= extent_list[storage.ordering(n)];
    } 
  }